

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O3

Colorf __thiscall Colorf::to_sRGB(Colorf *this)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  Colorf *pCVar4;
  float *pfVar5;
  int i;
  int iVar6;
  undefined1 auVar7 [64];
  Colorf CVar8;
  float local_3c;
  undefined8 local_38;
  undefined1 extraout_var [60];
  
  pfVar1 = &this->g;
  pfVar2 = &this->b;
  iVar6 = 0;
  local_38 = 0;
  local_3c = 0.0;
  do {
    pCVar4 = this;
    if ((iVar6 != 0) && (pCVar4 = (Colorf *)pfVar1, iVar6 != 1)) {
      pCVar4 = (Colorf *)pfVar2;
    }
    if (pCVar4->r <= 0.0031308) {
      pCVar4 = this;
      pfVar5 = (float *)&local_38;
      if ((iVar6 != 0) &&
         (pfVar5 = (float *)((long)&local_38 + 4), pCVar4 = (Colorf *)pfVar1, iVar6 != 1)) {
        pfVar5 = &local_3c;
        pCVar4 = (Colorf *)pfVar2;
      }
      *pfVar5 = pCVar4->r * 12.92;
    }
    else {
      pCVar4 = this;
      pfVar5 = (float *)&local_38;
      if ((iVar6 != 0) &&
         (pfVar5 = (float *)((long)&local_38 + 4), pCVar4 = (Colorf *)pfVar1, iVar6 != 1)) {
        pfVar5 = &local_3c;
        pCVar4 = (Colorf *)pfVar2;
      }
      auVar7._0_4_ = powf(pCVar4->r,0.41666666);
      auVar7._4_60_ = extraout_var;
      auVar3 = vfmadd132ss_fma(auVar7._0_16_,SUB6416(ZEXT464(0xbd6147ae),0),ZEXT416(0x3f870a3d));
      *pfVar5 = auVar3._0_4_;
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 3);
  CVar8.b = local_3c;
  CVar8.r = (float)(undefined4)local_38;
  CVar8.g = (float)local_38._4_4_;
  return CVar8;
}

Assistant:

Colorf Colorf::to_sRGB() const {
	const float a = 0.055f;
	const float b = 1.f / 2.4f;
	Colorf srgb;
	for (int i = 0; i < 3; ++i){
		if ((*this)[i] <= 0.0031308f){
			srgb[i] = 12.92f * (*this)[i];
		}
		else {
			srgb[i] = (1.f + a) * std::pow((*this)[i], b) - a;
		}
	}
	return srgb;
}